

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

int has_ext(char *ext)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  GLubyte *__s1;
  GLuint local_38;
  int local_34;
  GLint index;
  GLint num_exts;
  char *terminator;
  char *loc;
  char *extensions;
  char *ext_local;
  
  extensions = ext;
  if ((GLVersion.major < 3) || (glad_glGetStringi == (PFNGLGETSTRINGIPROC)0x0)) {
    loc = (char *)(*glad_glGetString)(0x1f03);
    if (((GLubyte *)loc == (GLubyte *)0x0) || (extensions == (char *)0x0)) {
      ext_local._4_4_ = 0;
    }
    else {
      do {
        pcVar2 = strstr(loc,extensions);
        if (pcVar2 == (char *)0x0) {
          return 0;
        }
        terminator = pcVar2;
        sVar3 = strlen(extensions);
        _index = pcVar2 + sVar3;
      } while (((terminator != loc) && (loc = _index, terminator[-1] != ' ')) ||
              ((*_index != ' ' && (loc = _index, *_index != '\0'))));
      ext_local._4_4_ = 1;
    }
  }
  else {
    (*glad_glGetIntegerv)(0x821d,&local_34);
    for (local_38 = 0; (int)local_38 < local_34; local_38 = local_38 + 1) {
      __s1 = (*glad_glGetStringi)(0x1f03,local_38);
      iVar1 = strcmp((char *)__s1,extensions);
      if (iVar1 == 0) {
        return 1;
      }
    }
    ext_local._4_4_ = 0;
  }
  return ext_local._4_4_;
}

Assistant:

static int has_ext(const char *ext) {
#if defined(GL_VERSION_3_0) || defined(GL_ES_VERSION_3_0)
    if(GLVersion.major < 3 || glGetStringi == NULL) {
#endif
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = (const char*) glGetString(GL_EXTENSIONS);
        if(extensions == NULL || ext == NULL) {
            return 0;
        }

        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }

            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
#if defined(GL_VERSION_3_0) || defined(GL_ES_VERSION_3_0)
    } else {
        GLint num_exts, index;

        glGetIntegerv(GL_NUM_EXTENSIONS, &num_exts);
        for(index = 0; index < num_exts; index++) {
            if(strcmp((const char*) glGetStringi(GL_EXTENSIONS, index), ext) == 0) {
                return 1;
            }
        }
    }
#endif

    return 0;
}